

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O2

void fm_eulerMatrix(float ax,float ay,float az,float *matrix)

{
  float quat [4];
  float afStack_28 [6];
  
  fm_eulerToQuat(ax,ay,az,afStack_28);
  fm_quatToMatrix(afStack_28,matrix);
  return;
}

Assistant:

void fm_eulerMatrix(float ax,float ay,float az,float *matrix) // convert euler (in radians) to a dest 4x4 matrix (translation set to zero)
{
  float quat[4];
  fm_eulerToQuat(ax,ay,az,quat);
  fm_quatToMatrix(quat,matrix);
}